

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.hxx
# Opt level: O2

void __thiscall nuraft::srv_config::srv_config(srv_config *this,int32 id,string *endpoint)

{
  this->id_ = id;
  this->dc_id_ = 0;
  std::__cxx11::string::string((string *)&this->endpoint_,(string *)endpoint);
  (this->aux_)._M_dataplus._M_p = (pointer)&(this->aux_).field_2;
  (this->aux_)._M_string_length = 0;
  (this->aux_).field_2._M_local_buf[0] = '\0';
  this->learner_ = false;
  this->priority_ = 1;
  return;
}

Assistant:

srv_config(int32 id, const std::string& endpoint)
        : id_(id)
        , dc_id_(0)
        , endpoint_(endpoint)
        , learner_(false)
        , priority_(INIT_PRIORITY)
        {}